

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::GenerateAddFileToPool
               (FileDescriptor *file,bool is_descriptor,Printer *printer)

{
  __type _Var1;
  bool bVar2;
  FileDescriptor *pFVar3;
  FileDescriptorProto *proto;
  Rep *pRVar4;
  undefined1 is_descriptor_00;
  string *in_RCX;
  void **ppvVar5;
  void **ppvVar6;
  int index;
  long lVar7;
  undefined7 in_register_00000031;
  int i_1;
  const_iterator position;
  ulong uVar8;
  int i;
  long lVar9;
  string files_data;
  char *local_a8;
  FileDescriptorSet files;
  string local_70;
  string local_50;
  
  io::Printer::Print<>
            (printer,
             "public static $is_initialized = false;\n\npublic static function initOnce() {\n");
  Indent(printer);
  io::Printer::Print<>
            (printer,
             "$pool = \\Google\\Protobuf\\Internal\\DescriptorPool::getGeneratedPool();\n\nif (static::$is_initialized == true) {\n  return;\n}\n"
            );
  if ((int)CONCAT71(in_register_00000031,is_descriptor) == 0) {
    for (index = 0; index < *(int *)(file + 0x20); index = index + 1) {
      pFVar3 = FileDescriptor::dependency(file,index);
      _Var1 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **
                               )pFVar3,&kDescriptorFile_abi_cxx11_);
      is_descriptor_00 = SUB81(in_RCX,0);
      if (!_Var1) {
        pFVar3 = FileDescriptor::dependency(file,index);
        GeneratedMetadataFileName_abi_cxx11_
                  ((string *)&files,(php *)pFVar3,(FileDescriptor *)0x0,(bool)is_descriptor_00);
        FilenameToClassname(&files_data,(string *)&files);
        in_RCX = &files_data;
        io::Printer::Print<char[5],std::__cxx11::string>
                  (printer,"\\^name^::initOnce();\n",(char (*) [5])0x38d8c6,&files_data);
        std::__cxx11::string::~string((string *)&files_data);
        std::__cxx11::string::~string((string *)&files);
      }
    }
    FileDescriptorSet::FileDescriptorSet(&files);
    proto = RepeatedPtrField<google::protobuf::FileDescriptorProto>::Add(&files.file_);
    FileDescriptor::CopyTo(file,proto);
    pRVar4 = (proto->dependency_).super_RepeatedPtrFieldBase.rep_;
    position.it_ = pRVar4->elements;
    if (pRVar4 == (Rep *)0x0) {
      position.it_ = (void **)0x0;
    }
    while( true ) {
      ppvVar5 = pRVar4->elements;
      if (pRVar4 == (Rep *)0x0) {
        ppvVar5 = (void **)0x0;
      }
      if (position.it_ == ppvVar5 + (proto->dependency_).super_RepeatedPtrFieldBase.current_size_)
      goto LAB_002a0e2a;
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              *position.it_,&kDescriptorFile_abi_cxx11_);
      if (bVar2) break;
      position.it_ = position.it_ + 1;
      pRVar4 = (proto->dependency_).super_RepeatedPtrFieldBase.rep_;
    }
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::erase(&proto->dependency_,position);
LAB_002a0e2a:
    internal::RepeatedPtrFieldBase::
    Clear<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
              (&(proto->extension_).super_RepeatedPtrFieldBase);
    pRVar4 = (proto->message_type_).super_RepeatedPtrFieldBase.rep_;
    ppvVar5 = pRVar4->elements;
    if (pRVar4 == (Rep *)0x0) {
      ppvVar5 = (void **)0x0;
    }
    while( true ) {
      ppvVar6 = pRVar4->elements;
      if (pRVar4 == (Rep *)0x0) {
        ppvVar6 = (void **)0x0;
      }
      if (ppvVar5 == ppvVar6 + (proto->message_type_).super_RepeatedPtrFieldBase.current_size_)
      break;
      internal::RepeatedPtrFieldBase::
      Clear<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                ((RepeatedPtrFieldBase *)((long)*ppvVar5 + 0x78));
      ppvVar5 = ppvVar5 + 1;
      pRVar4 = (proto->message_type_).super_RepeatedPtrFieldBase.rep_;
    }
    files_data._M_dataplus._M_p = (pointer)&files_data.field_2;
    files_data._M_string_length = 0;
    files_data.field_2._M_local_buf[0] = '\0';
    MessageLite::SerializeToString((MessageLite *)&files,&files_data);
    io::Printer::Print<>(printer,"$pool->internalAddGeneratedFile(hex2bin(\n");
    Indent(printer);
    uVar8 = 0;
    while (uVar8 < files_data._M_string_length) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&files_data);
      BinaryToHex(&local_50,&local_70);
      uVar8 = uVar8 + 0x1e;
      local_a8 = "";
      if (uVar8 < files_data._M_string_length) {
        local_a8 = " .";
      }
      io::Printer::Print<char[5],std::__cxx11::string,char[4],char_const*>
                (printer,"\"^data^\"^dot^\n",(char (*) [5])0x39e7b5,&local_50,(char (*) [4])"dot",
                 &local_a8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    Outdent(printer);
    io::Printer::Print<>(printer,"), true);\n\n");
    std::__cxx11::string::~string((string *)&files_data);
    FileDescriptorSet::~FileDescriptorSet(&files);
  }
  else {
    lVar7 = 0;
    for (lVar9 = 0; lVar9 < *(int *)(file + 0x2c); lVar9 = lVar9 + 1) {
      std::__cxx11::string::string((string *)&files,"",(allocator *)&files_data);
      GenerateMessageToPool((string *)&files,(Descriptor *)(*(long *)(file + 0x68) + lVar7),printer)
      ;
      std::__cxx11::string::~string((string *)&files);
      lVar7 = lVar7 + 0x90;
    }
    lVar9 = 0;
    for (lVar7 = 0; lVar7 < *(int *)(file + 0x30); lVar7 = lVar7 + 1) {
      GenerateEnumToPool((EnumDescriptor *)(*(long *)(file + 0x70) + lVar9),printer);
      lVar9 = lVar9 + 0x50;
    }
    io::Printer::Print<>(printer,"$pool->finish();\n");
  }
  io::Printer::Print<>(printer,"static::$is_initialized = true;\n");
  Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  return;
}

Assistant:

void GenerateAddFileToPool(const FileDescriptor* file, bool is_descriptor,
                           io::Printer* printer) {
    printer->Print(
        "public static $is_initialized = false;\n\n"
        "public static function initOnce() {\n");
    Indent(printer);

    printer->Print(
        "$pool = \\Google\\Protobuf\\Internal\\"
        "DescriptorPool::getGeneratedPool();\n\n"
        "if (static::$is_initialized == true) {\n"
        "  return;\n"
        "}\n");

  if (is_descriptor) {
    for (int i = 0; i < file->message_type_count(); i++) {
      GenerateMessageToPool("", file->message_type(i), printer);
    }
    for (int i = 0; i < file->enum_type_count(); i++) {
      GenerateEnumToPool(file->enum_type(i), printer);
    }

    printer->Print(
        "$pool->finish();\n");
  } else {
    for (int i = 0; i < file->dependency_count(); i++) {
      const std::string& name = file->dependency(i)->name();
      // Currently, descriptor.proto is not ready for external usage. Skip to
      // import it for now, so that its dependencies can still work as long as
      // they don't use protos defined in descriptor.proto.
      if (name == kDescriptorFile) {
        continue;
      }
      std::string dependency_filename =
          GeneratedMetadataFileName(file->dependency(i), is_descriptor);
      printer->Print(
          "\\^name^::initOnce();\n",
          "name", FilenameToClassname(dependency_filename));
    }

    // Add messages and enums to descriptor pool.
    FileDescriptorSet files;
    FileDescriptorProto* file_proto = files.add_file();
    file->CopyTo(file_proto);

    // Filter out descriptor.proto as it cannot be depended on for now.
    RepeatedPtrField<string>* dependency = file_proto->mutable_dependency();
    for (RepeatedPtrField<string>::iterator it = dependency->begin();
         it != dependency->end(); ++it) {
      if (*it != kDescriptorFile) {
        dependency->erase(it);
        break;
      }
    }

    // Filter out all extensions, since we do not support extension yet.
    file_proto->clear_extension();
    RepeatedPtrField<DescriptorProto>* message_type =
        file_proto->mutable_message_type();
    for (RepeatedPtrField<DescriptorProto>::iterator it = message_type->begin();
         it != message_type->end(); ++it) {
      it->clear_extension();
    }

    string files_data;
    files.SerializeToString(&files_data);

    printer->Print("$pool->internalAddGeneratedFile(hex2bin(\n");
    Indent(printer);

    // Only write 30 bytes per line.
    static const int kBytesPerLine = 30;
    for (int i = 0; i < files_data.size(); i += kBytesPerLine) {
      printer->Print(
          "\"^data^\"^dot^\n",
          "data", BinaryToHex(files_data.substr(i, kBytesPerLine)),
          "dot", i + kBytesPerLine < files_data.size() ? " ." : "");
    }

    Outdent(printer);
    printer->Print(
        "), true);\n\n");
  }
  printer->Print(
      "static::$is_initialized = true;\n");
  Outdent(printer);
  printer->Print("}\n");
}